

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::throwCppExceptionMessage(Forth *this,string *msg,errorCodes ec)

{
  Cell CVar1;
  Cell CVar2;
  AbortException *this_00;
  string buffer;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  initClass(this);
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  CVar1 = getSourceAddress(this);
  CVar2 = getSourceBufferSize(this);
  moveFromDataSpace(this,&buffer,CVar1,(ulong)CVar2);
  this_00 = (AbortException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_e0,msg,"\nError code ");
  std::__cxx11::to_string(&local_100,ec);
  std::operator+(&local_c0,&local_e0,&local_100);
  std::operator+(&local_a0,&local_c0,"\n");
  std::operator+(&local_80,&local_a0,&buffer);
  std::operator+(&local_60,&local_80,"\n Offset ");
  CVar1 = getSourceBufferOffset(this);
  std::__cxx11::to_string(&local_120,CVar1);
  std::operator+(&local_40,&local_60,&local_120);
  AbortException::AbortException(this_00,&local_40);
  __cxa_throw(this_00,&AbortException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwCppExceptionMessage(const std::string &msg, enum errorCodes ec){
			initClass();
			std::string buffer{};
			int ecInt=static_cast<int>(ec);
			moveFromDataSpace(buffer, getSourceAddress(), getSourceBufferSize());
			throw AbortException(msg + "\nError code " + std::to_string(ecInt) +"\n" + buffer + "\n Offset " + std::to_string(getSourceBufferOffset()));
		}